

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall ChainstateManager::DeleteSnapshotChainstate(ChainstateManager *this)

{
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  Chainstate *pCVar3;
  bool bVar4;
  path *__p;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  path pStack_b8;
  undefined1 local_90 [40];
  bool local_68;
  path snapshot_datadir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<Chainstate,std::default_delete<Chainstate>>&>
            (&this->m_snapshot_chainstate,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x18d2,"DeleteSnapshotChainstate","m_snapshot_chainstate");
  inline_assertion_check<true,std::unique_ptr<Chainstate,std::default_delete<Chainstate>>&>
            (&this->m_ibd_chainstate,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x18d3,"DeleteSnapshotChainstate","m_ibd_chainstate");
  ::node::FindSnapshotChainstateDir((optional<fs::path> *)local_90,&(this->m_options).datadir);
  __p = (path *)inline_assertion_check<true,std::optional<fs::path>>
                          ((optional<fs::path> *)local_90,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                           ,0x18d5,"DeleteSnapshotChainstate",
                           "node::FindSnapshotChainstateDir(m_options.datadir)");
  if (*(char *)&__p[1]._M_pathname._M_dataplus._M_p == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    std::filesystem::__cxx11::path::path(&snapshot_datadir.super_path,__p);
    if (local_68 == true) {
      local_68 = false;
      std::filesystem::__cxx11::path::~path((path *)local_90);
    }
    std::filesystem::__cxx11::path::path(&pStack_b8,&snapshot_datadir.super_path);
    bVar4 = DeleteCoinsDBFromDisk((path *)&pStack_b8,true);
    std::filesystem::__cxx11::path::~path(&pStack_b8);
    if (bVar4) {
      _Var2._M_head_impl =
           (this->m_ibd_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      pCVar3 = (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      this->m_active_chainstate = _Var2._M_head_impl;
      (_Var2._M_head_impl)->m_mempool = pCVar3->m_mempool;
      pCVar3 = (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      (this->m_snapshot_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
      if (pCVar3 != (Chainstate *)0x0) {
        std::default_delete<Chainstate>::operator()
                  ((default_delete<Chainstate> *)&this->m_snapshot_chainstate,pCVar3);
      }
    }
    else {
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,snapshot_datadir.super_path._M_pathname._M_dataplus._M_p,
                 snapshot_datadir.super_path._M_pathname._M_dataplus._M_p +
                 snapshot_datadir.super_path._M_pathname._M_string_length);
      logging_function._M_str = "DeleteSnapshotChainstate";
      logging_function._M_len = 0x18;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x18d8,ALL,Info,(ConstevalFormatString<1U>)0x810a65,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
    }
    std::filesystem::__cxx11::path::~path(&snapshot_datadir.super_path);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::DeleteSnapshotChainstate()
{
    AssertLockHeld(::cs_main);
    Assert(m_snapshot_chainstate);
    Assert(m_ibd_chainstate);

    fs::path snapshot_datadir = Assert(node::FindSnapshotChainstateDir(m_options.datadir)).value();
    if (!DeleteCoinsDBFromDisk(snapshot_datadir, /*is_snapshot=*/ true)) {
        LogPrintf("Deletion of %s failed. Please remove it manually to continue reindexing.\n",
                  fs::PathToString(snapshot_datadir));
        return false;
    }
    m_active_chainstate = m_ibd_chainstate.get();
    m_active_chainstate->m_mempool = m_snapshot_chainstate->m_mempool;
    m_snapshot_chainstate.reset();
    return true;
}